

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O1

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
::copy_elements_from
          (table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
           *this,table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
                 *x)

{
  value_type_pointer __dest;
  value_type_pointer __src;
  size_t sVar1;
  
  if ((this->arrays).groups_size_mask != (x->arrays).groups_size_mask) {
    for_all_elements_while<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____external_boost_unordered_hpp:6939:48)>
              (&x->arrays,(anon_class_8_1_54a39806 *)&stack0xfffffffffffffff8);
    return;
  }
  __dest = (this->arrays).elements_;
  if ((__dest != (value_type_pointer)0x0) &&
     (__src = (x->arrays).elements_, __src != (value_type_pointer)0x0)) {
    memcpy(__dest,__src,(x->arrays).groups_size_mask * 0x78 + 0x70);
    memcpy((this->arrays).groups_,(x->arrays).groups_,(this->arrays).groups_size_mask * 0x10 + 0x10)
    ;
    sVar1 = (x->size_ctrl).size;
    (this->size_ctrl).ml = (x->size_ctrl).ml;
    (this->size_ctrl).size = sVar1;
  }
  return;
}

Assistant:

void copy_elements_from(const table_core& x) {
        BOOST_ASSERT(empty());
        BOOST_ASSERT(this != std::addressof(x));
        if (arrays.groups_size_mask == x.arrays.groups_size_mask) {
            fast_copy_elements_from(x);
        }
        else {
            x.for_all_elements([this](const element_type* p) { unchecked_insert(*p); });
        }
    }